

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O0

VP8LDecoder * VP8LNew(void)

{
  VP8LDecoder *pVVar1;
  VP8LDecoder *dec;
  size_t in_stack_fffffffffffffff0;
  uint64_t in_stack_fffffffffffffff8;
  
  pVVar1 = (VP8LDecoder *)WebPSafeCalloc(in_stack_fffffffffffffff8,in_stack_fffffffffffffff0);
  if (pVVar1 == (VP8LDecoder *)0x0) {
    pVVar1 = (VP8LDecoder *)0x0;
  }
  else {
    pVVar1->status = VP8_STATUS_OK;
    pVVar1->state = READ_DIM;
    VP8LDspInit();
  }
  return pVVar1;
}

Assistant:

VP8LDecoder* VP8LNew(void) {
  VP8LDecoder* const dec = (VP8LDecoder*)WebPSafeCalloc(1ULL, sizeof(*dec));
  if (dec == NULL) return NULL;
  dec->status = VP8_STATUS_OK;
  dec->state = READ_DIM;

  VP8LDspInit();  // Init critical function pointers.

  return dec;
}